

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O3

bool __thiscall MuxerManager::openMetaFile(MuxerManager *this,string *fileName)

{
  string *opts;
  bool bVar1;
  long lVar2;
  string *line;
  string str;
  TextFile file;
  string local_b0;
  string *local_90;
  string local_88;
  File local_68;
  
  local_90 = fileName;
  File::File(&local_68,(fileName->_M_dataplus)._M_p,1,0);
  local_68.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream =
       (AbstractStream)&PTR__File_0023ddc8;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  line = &local_b0;
  TextFile::readLine((TextFile *)&local_68,line);
  opts = &this->m_muxOpts;
  while (local_b0._M_string_length != 0) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"MUXOPT","");
    bVar1 = strStartWith(&local_b0,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)opts);
      parseMuxOpt(this,opts);
      lVar2 = std::__cxx11::string::find((char *)opts,0x206d3a,0);
      this->m_mvcBaseViewR = lVar2 != -1;
    }
    line = &local_b0;
    TextFile::readLine((TextFile *)&local_68,&local_b0);
  }
  File::close(&local_68,(int)line);
  METADemuxer::openFile(&this->m_metaDemuxer,local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  File::~File(&local_68);
  return true;
}

Assistant:

bool MuxerManager::openMetaFile(const string& fileName)
{
    TextFile file(fileName.c_str(), File::ofRead);
    std::string str;
    file.readLine(str);
    while (str.length() > 0)
    {
        if (strStartWith(str, "MUXOPT"))
        {
            m_muxOpts = str;
            parseMuxOpt(m_muxOpts);
            m_mvcBaseViewR = m_muxOpts.find("right-eye") != string::npos;
        }
        file.readLine(str);
    }
    file.close();

    m_metaDemuxer.openFile(fileName);
    return true;
}